

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double bradford_cdf(double x,double a,double b,double c)

{
  double dVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (a < x) {
    if (x <= b) {
      dVar2 = log(((x - a) * c) / (b - a) + 1.0);
      dVar1 = log(c + 1.0);
      dVar2 = dVar2 / dVar1;
    }
    else if (b < x) {
      dVar2 = 1.0;
    }
  }
  return dVar2;
}

Assistant:

double bradford_cdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_CDF evaluates the Bradford CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, double BRADFORD_CDF, the value of the CDF.
//
{
  double cdf = 0.0;

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else if ( x <= b )
  {
    cdf = log ( 1.0 + c * ( x - a ) / ( b - a ) ) / log ( c + 1.0 );
  }
  else if ( b < x )
  {
    cdf = 1.0;
  }

  return cdf;
}